

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

lostFraction __thiscall
llvm::detail::IEEEFloat::multiplySignificand(IEEEFloat *this,IEEEFloat *rhs,IEEEFloat *addend)

{
  fltSemantics *pfVar1;
  fltSemantics *pfVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  opStatus oVar6;
  lostFraction lVar7;
  lostFraction lVar8;
  Significand dst;
  Significand SVar9;
  Significand *rhs_00;
  uint uVar10;
  uint uVar11;
  uint Count;
  uint lhsParts;
  bool bVar12;
  bool ignored;
  fltSemantics extendedSemantics;
  IEEEFloat extendedAddend;
  integerPart scratch [4];
  bool local_b1;
  Significand *local_b0;
  ulong local_a8;
  IEEEFloat *local_a0;
  fltSemantics local_98;
  Significand local_88;
  fltSemantics *local_80;
  Significand *local_78;
  IEEEFloat local_70;
  undefined1 local_58 [40];
  
  pfVar1 = this->semantics;
  pfVar2 = rhs->semantics;
  if (pfVar1 != pfVar2) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x3b9,
                  "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                 );
  }
  local_a8 = (ulong)pfVar1->precision;
  uVar10 = pfVar1->precision * 2 + 0x40;
  uVar11 = uVar10 >> 6;
  local_a0 = addend;
  if (uVar10 < 0x140) {
    dst.parts = (integerPart *)local_58;
  }
  else {
    dst.parts = (integerPart *)operator_new__((ulong)(uVar11 * 8));
  }
  local_78 = &this->significand;
  local_b0 = local_78;
  if (pfVar1->precision - 0x40 < 0xffffff80) {
    local_b0 = (Significand *)(this->significand).parts;
  }
  lhsParts = pfVar1->precision + 0x40 >> 6;
  if (pfVar2->precision - 0x40 < 0xffffff80) {
    rhs_00 = (Significand *)(rhs->significand).parts;
  }
  else {
    rhs_00 = &rhs->significand;
  }
  APInt::tcFullMultiply((WordType *)dst,&local_b0->part,&rhs_00->part,lhsParts,lhsParts);
  uVar5 = APInt::tcMSB((WordType *)dst,uVar11);
  uVar5 = uVar5 + 1;
  this->exponent = rhs->exponent + this->exponent + 2;
  lVar7 = lfExactlyZero;
  if ((local_a0 != (IEEEFloat *)0x0) && ((local_a0->field_0x12 & 7) != 3)) {
    uVar4 = (int)local_a8 * 2;
    local_80 = this->semantics;
    local_88 = this->significand;
    Count = uVar4 - uVar5;
    if (Count != 0) {
      if (uVar4 < uVar5) {
        __assert_fail("extendedPrecision > omsb",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x3e9,
                      "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                     );
      }
      APInt::tcShiftLeft((WordType *)dst,uVar11,Count);
      this->exponent = this->exponent - (short)Count;
    }
    pfVar1 = this->semantics;
    uVar3._0_2_ = pfVar1->maxExponent;
    uVar3._2_2_ = pfVar1->minExponent;
    uVar3._4_4_ = pfVar1->precision;
    local_98.sizeInBits = pfVar1->sizeInBits;
    local_98._0_4_ = SUB84(uVar3,0);
    local_98.precision = (int)local_a8 * 2 + 1;
    SVar9 = dst;
    if (uVar11 == 1) {
      SVar9.part = *dst.parts;
    }
    (this->significand).parts = (integerPart *)SVar9;
    this->semantics = &local_98;
    IEEEFloat(&local_70,local_a0);
    oVar6 = convert(&local_70,&local_98,rmTowardZero,&local_b1);
    if (oVar6 != opOK) {
      __assert_fail("status == opOK",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x3fb,
                    "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                   );
    }
    lVar7 = shiftSignificandRight(&local_70,1);
    if (lVar7 != lfExactlyZero) {
      __assert_fail("lost_fraction == lfExactlyZero && \"Lost precision while shifting addend for fused-multiply-add.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x403,
                    "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                   );
    }
    lVar7 = addOrSubtractSignificand(this,&local_70,false);
    if (uVar11 == 1) {
      *dst.parts = (integerPart)*local_78;
    }
    this->significand = local_88;
    this->semantics = local_80;
    uVar5 = APInt::tcMSB(dst.parts,uVar11);
    uVar5 = uVar5 + 1;
    ~IEEEFloat(&local_70);
  }
  this->exponent = this->exponent + ~(ushort)local_a8;
  uVar11 = uVar5 - (uint)local_a8;
  if ((uint)local_a8 <= uVar5 && uVar11 != 0) {
    uVar5 = uVar5 + 0x3f >> 6;
    lVar8 = lostFractionThroughTruncation(dst.parts,uVar5,uVar11);
    APInt::tcShiftRight(dst.parts,uVar5,uVar11);
    bVar12 = lVar7 != lfExactlyZero;
    lVar7 = lVar8;
    if (bVar12) {
      if (lVar8 == lfExactlyZero) {
        lVar7 = lfLessThanHalf;
      }
      else {
        lVar7 = lfMoreThanHalf;
        if (lVar8 != lfExactlyHalf) {
          lVar7 = lVar8;
        }
      }
    }
    this->exponent = this->exponent + (short)uVar11;
  }
  APInt::tcAssign(&local_b0->part,dst.parts,lhsParts);
  if (0x13f < uVar10) {
    operator_delete__(dst.parts);
  }
  return lVar7;
}

Assistant:

lostFraction IEEEFloat::multiplySignificand(const IEEEFloat &rhs,
                                            const IEEEFloat *addend) {
  unsigned int omsb;        // One, not zero, based MSB.
  unsigned int partsCount, newPartsCount, precision;
  integerPart *lhsSignificand;
  integerPart scratch[4];
  integerPart *fullSignificand;
  lostFraction lost_fraction;
  bool ignored;

  assert(semantics == rhs.semantics);

  precision = semantics->precision;

  // Allocate space for twice as many bits as the original significand, plus one
  // extra bit for the addition to overflow into.
  newPartsCount = partCountForBits(precision * 2 + 1);

  if (newPartsCount > 4)
    fullSignificand = new integerPart[newPartsCount];
  else
    fullSignificand = scratch;

  lhsSignificand = significandParts();
  partsCount = partCount();

  APInt::tcFullMultiply(fullSignificand, lhsSignificand,
                        rhs.significandParts(), partsCount, partsCount);

  lost_fraction = lfExactlyZero;
  omsb = APInt::tcMSB(fullSignificand, newPartsCount) + 1;
  exponent += rhs.exponent;

  // Assume the operands involved in the multiplication are single-precision
  // FP, and the two multiplicants are:
  //   *this = a23 . a22 ... a0 * 2^e1
  //     rhs = b23 . b22 ... b0 * 2^e2
  // the result of multiplication is:
  //   *this = c48 c47 c46 . c45 ... c0 * 2^(e1+e2)
  // Note that there are three significant bits at the left-hand side of the
  // radix point: two for the multiplication, and an overflow bit for the
  // addition (that will always be zero at this point). Move the radix point
  // toward left by two bits, and adjust exponent accordingly.
  exponent += 2;

  if (addend && addend->isNonZero()) {
    // The intermediate result of the multiplication has "2 * precision"
    // signicant bit; adjust the addend to be consistent with mul result.
    //
    Significand savedSignificand = significand;
    const fltSemantics *savedSemantics = semantics;
    fltSemantics extendedSemantics;
    opStatus status;
    unsigned int extendedPrecision;

    // Normalize our MSB to one below the top bit to allow for overflow.
    extendedPrecision = 2 * precision + 1;
    if (omsb != extendedPrecision - 1) {
      assert(extendedPrecision > omsb);
      APInt::tcShiftLeft(fullSignificand, newPartsCount,
                         (extendedPrecision - 1) - omsb);
      exponent -= (extendedPrecision - 1) - omsb;
    }

    /* Create new semantics.  */
    extendedSemantics = *semantics;
    extendedSemantics.precision = extendedPrecision;

    if (newPartsCount == 1)
      significand.part = fullSignificand[0];
    else
      significand.parts = fullSignificand;
    semantics = &extendedSemantics;

    IEEEFloat extendedAddend(*addend);
    status = extendedAddend.convert(extendedSemantics, rmTowardZero, &ignored);
    assert(status == opOK);
    (void)status;

    // Shift the significand of the addend right by one bit. This guarantees
    // that the high bit of the significand is zero (same as fullSignificand),
    // so the addition will overflow (if it does overflow at all) into the top bit.
    lost_fraction = extendedAddend.shiftSignificandRight(1);
    assert(lost_fraction == lfExactlyZero &&
           "Lost precision while shifting addend for fused-multiply-add.");
    (void)lost_fraction;

    lost_fraction = addOrSubtractSignificand(extendedAddend, false);

    /* Restore our state.  */
    if (newPartsCount == 1)
      fullSignificand[0] = significand.part;
    significand = savedSignificand;
    semantics = savedSemantics;

    omsb = APInt::tcMSB(fullSignificand, newPartsCount) + 1;
  }

  // Convert the result having "2 * precision" significant-bits back to the one
  // having "precision" significant-bits. First, move the radix point from
  // poision "2*precision - 1" to "precision - 1". The exponent need to be
  // adjusted by "2*precision - 1" - "precision - 1" = "precision".
  exponent -= precision + 1;

  // In case MSB resides at the left-hand side of radix point, shift the
  // mantissa right by some amount to make sure the MSB reside right before
  // the radix point (i.e. "MSB . rest-significant-bits").
  //
  // Note that the result is not normalized when "omsb < precision". So, the
  // caller needs to call IEEEFloat::normalize() if normalized value is
  // expected.
  if (omsb > precision) {
    unsigned int bits, significantParts;
    lostFraction lf;

    bits = omsb - precision;
    significantParts = partCountForBits(omsb);
    lf = shiftRight(fullSignificand, significantParts, bits);
    lost_fraction = combineLostFractions(lf, lost_fraction);
    exponent += bits;
  }

  APInt::tcAssign(lhsSignificand, fullSignificand, partsCount);

  if (newPartsCount > 4)
    delete [] fullSignificand;

  return lost_fraction;
}